

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::
checkDeviceBufferTypeIs
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,
          DeviceBufferType targetType)

{
  DeviceBufferType *in_RDX;
  DeviceBufferType *d;
  DeviceBufferType local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (this->deviceBufferType != targetType) {
    local_b4 = targetType;
    deviceBufferTypeName_abi_cxx11_(&local_30,(polyscope *)&local_b4,in_RDX);
    std::operator+(&local_90,"ManagedBuffer has wrong type for this operation. Expected ",&local_30)
    ;
    std::operator+(&local_70,&local_90," but is ");
    deviceBufferTypeName_abi_cxx11_(&local_b0,(polyscope *)&this->deviceBufferType,d);
    std::operator+(&local_50,&local_70,&local_b0);
    exception(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::checkDeviceBufferTypeIs(DeviceBufferType targetType) {
  if (targetType != deviceBufferType) {
    exception("ManagedBuffer has wrong type for this operation. Expected " + deviceBufferTypeName(targetType) +
              " but is " + deviceBufferTypeName(deviceBufferType));
  }
}